

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.cc
# Opt level: O3

void __thiscall
sptk::InputSourceInterpolation::InputSourceInterpolation
          (InputSourceInterpolation *this,int frame_period,int interpolation_period,
          bool use_final_frame_for_exceeded_frame,InputSourceInterface *source)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer __src;
  int iVar1;
  size_t __n;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterpolation_00110c58;
  this->frame_period_ = frame_period;
  this->interpolation_period_ = interpolation_period;
  this->first_interpolation_period_ = interpolation_period / 2;
  this->use_final_frame_for_exceeded_frame_ = use_final_frame_for_exceeded_frame;
  this->remained_num_samples_ = 0;
  this->data_length_ = 0;
  this->point_index_in_frame_ = 0;
  this->source_ = source;
  this->is_valid_ = true;
  (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((0 < frame_period) &&
     (source != (InputSourceInterface *)0x0 && (uint)interpolation_period <= (uint)frame_period >> 1
     )) {
    this_00 = &this->next_data_;
    iVar1 = (*source->_vptr_InputSourceInterface[3])(source);
    if ((char)iVar1 != '\0') {
      iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&this->curr_data_);
      if ((char)iVar1 == '\0') {
        this->remained_num_samples_ = 0;
        return;
      }
      this->remained_num_samples_ = this->frame_period_ + 1;
      this->data_length_ =
           (int)((ulong)((long)(this->curr_data_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,this_00);
      if ((char)iVar1 == '\0') {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->data_length_);
        __src = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
        __n = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
        this->remained_num_samples_ = 1;
      }
      if (this->interpolation_period_ < 1) {
        return;
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this->increment_,(long)this->data_length_);
      CalculateIncrement(this);
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

InputSourceInterpolation::InputSourceInterpolation(
    int frame_period, int interpolation_period,
    bool use_final_frame_for_exceeded_frame, InputSourceInterface* source)
    : frame_period_(frame_period),
      interpolation_period_(interpolation_period),
      first_interpolation_period_(interpolation_period_ / 2),
      use_final_frame_for_exceeded_frame_(use_final_frame_for_exceeded_frame),
      remained_num_samples_(0),
      data_length_(0),
      point_index_in_frame_(0),
      source_(source),
      is_valid_(true) {
  if (frame_period_ <= 0 || interpolation_period_ < 0 ||
      frame_period_ / 2 < interpolation_period_ || NULL == source_ ||
      !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  if (!source_->Get(&curr_data_)) {
    remained_num_samples_ = 0;
    return;
  }

  remained_num_samples_ = frame_period_ + 1;
  data_length_ = static_cast<int>(curr_data_.size());

  if (!source_->Get(&next_data_)) {
    next_data_.resize(data_length_);
    std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
    remained_num_samples_ = 1;
  }

  if (0 < interpolation_period_) {
    increment_.resize(data_length_);
    CalculateIncrement();
  }
}